

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O0

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::MaybeAddResult
          (S2ClosestEdgeQueryBase<S2MinDistance> *this,S2Shape *shape,int edge_id)

{
  S1ChordAngle distance_00;
  int iVar1;
  uint uVar2;
  byte local_99;
  Result local_90;
  S1ChordAngle local_80;
  S2MinDistance distance;
  Edge edge;
  pair<gtl::dense_hashtable_const_iterator<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>,_bool>
  local_40;
  uint local_1c;
  S2Shape *pSStack_18;
  int edge_id_local;
  S2Shape *shape_local;
  S2ClosestEdgeQueryBase<S2MinDistance> *this_local;
  
  local_99 = 0;
  local_1c = edge_id;
  pSStack_18 = shape;
  shape_local = (S2Shape *)this;
  if ((this->avoid_duplicates_ & 1U) != 0) {
    iVar1 = S2Shape::id(shape);
    s2shapeutil::ShapeEdgeId::ShapeEdgeId((ShapeEdgeId *)(edge.v1.c_ + 2),iVar1,local_1c);
    gtl::
    dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
    ::insert(&local_40,&this->tested_edges_,(value_type *)(edge.v1.c_ + 2));
    local_99 = local_40.second ^ 0xff;
  }
  if ((local_99 & 1) == 0) {
    (*pSStack_18->_vptr_S2Shape[3])(&distance,pSStack_18,(ulong)local_1c);
    local_80.length2_ = (this->distance_limit_).super_S1ChordAngle.length2_;
    uVar2 = (*this->target_->_vptr_S2DistanceTarget[4])
                      (this->target_,&distance,edge.v0.c_ + 2,&local_80);
    distance_00.length2_ = local_80.length2_;
    if ((uVar2 & 1) != 0) {
      iVar1 = S2Shape::id(pSStack_18);
      Result::Result(&local_90,(S2MinDistance)distance_00.length2_,iVar1,local_1c);
      AddResult(this,&local_90);
    }
  }
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::MaybeAddResult(
    const S2Shape& shape, int edge_id) {
  if (avoid_duplicates_ &&
      !tested_edges_.insert(ShapeEdgeId(shape.id(), edge_id)).second) {
    return;
  }
  auto edge = shape.edge(edge_id);
  Distance distance = distance_limit_;
  if (target_->UpdateMinDistance(edge.v0, edge.v1, &distance)) {
    AddResult(Result(distance, shape.id(), edge_id));
  }
}